

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_textedit_move_to_word_previous(nk_text_edit *state)

{
  int iVar1;
  int iVar2;
  int idx;
  
  iVar2 = state->cursor;
  do {
    idx = iVar2 + -1;
    if (iVar2 < 1) break;
    iVar1 = nk_is_word_boundary(state,idx);
    iVar2 = idx;
  } while (iVar1 == 0);
  iVar2 = 0;
  if (0 < idx) {
    iVar2 = idx;
  }
  return iVar2;
}

Assistant:

NK_INTERN int
nk_textedit_move_to_word_previous(struct nk_text_edit *state)
{
int c = state->cursor - 1;
while( c >= 0 && !nk_is_word_boundary(state, c))
--c;

if( c < 0 )
c = 0;

return c;
}